

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_test.cpp
# Opt level: O1

void __thiscall vm_test_disassemble_bad_Test::TestBody(vm_test_disassemble_bad_Test *this)

{
  allocator_type *paVar1;
  vm1_type *this_00;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  allocator_type local_3b;
  uchar local_3a [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  instr_set_type *local_20;
  pointer local_18;
  pointer puStack_10;
  
  local_3a[0] = 8;
  paVar1 = &local_3b;
  __l._M_len = 1;
  __l._M_array = local_3a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_38,__l,paVar1);
  this_00 = &(this->super_vm_test).vm1;
  local_20 = (instr_set_type *)
             local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_18 = (pointer)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  puStack_10 = (pointer)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (anonymous_namespace)::vm_test::
  check_diassembler_nok<mvm::vm<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>>
            ((vm_test *)this_00,
             (vm<mvm::test::test_instr_set,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>_>_>
              *)&stack0xffffffffffffffe0,(prog_chunk *)0x5,(status_type)paVar1);
  if (local_20 != (instr_set_type *)0x0) {
    operator_delete(local_20,(long)puStack_10 - (long)local_20);
  }
  if ((instr_set_type *)
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (instr_set_type *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3a[0] = '\x01';
  local_3a[1] = '\x01';
  paVar1 = &local_3b;
  __l_00._M_len = 2;
  __l_00._M_array = local_3a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_38,__l_00,paVar1);
  local_20 = (instr_set_type *)
             local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_18 = (pointer)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  puStack_10 = (pointer)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (anonymous_namespace)::vm_test::
  check_diassembler_nok<mvm::vm<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>>
            ((vm_test *)this_00,
             (vm<mvm::test::test_instr_set,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>_>_>
              *)&stack0xffffffffffffffe0,(prog_chunk *)0x6,(status_type)paVar1);
  if (local_20 != (instr_set_type *)0x0) {
    operator_delete(local_20,(long)puStack_10 - (long)local_20);
  }
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(vm_test, disassemble_bad) {
  check_diassembler_nok(vm1, prog_chunk({0x8}),
                        status_type::INVALID_INSTR_OPCODE);
  check_diassembler_nok(vm1, prog_chunk({0x1, 0x1}),
                        status_type::CODE_OVERFLOW);
}